

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporterUtils.cpp
# Opt level: O2

FrontLoadedReporterDisposer
ApprovalTests::CIBuildOnlyReporterUtils::useAsFrontLoadedReporter
          (shared_ptr<ApprovalTests::Reporter> *reporter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FrontLoadedReporterDisposer FVar1;
  shared_ptr<ApprovalTests::Reporter> local_38;
  shared_ptr<ApprovalTests::Reporter> local_28;
  
  ::std::
  make_shared<ApprovalTests::CIBuildOnlyReporter,std::shared_ptr<ApprovalTests::Reporter>const&>
            (&local_38);
  local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FrontLoadedReporterDisposer::FrontLoadedReporterDisposer
            ((FrontLoadedReporterDisposer *)reporter,&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FVar1.previous_result.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  FVar1.previous_result.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)reporter;
  return (FrontLoadedReporterDisposer)
         FVar1.previous_result.
         super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FrontLoadedReporterDisposer CIBuildOnlyReporterUtils::useAsFrontLoadedReporter(
        const std::shared_ptr<Reporter>& reporter)
    {
        return Approvals::useAsFrontLoadedReporter(
            std::make_shared<ApprovalTests::CIBuildOnlyReporter>(reporter));
    }